

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

bool __thiscall wallet::SelectionResult::operator<(SelectionResult *this,SelectionResult other)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  long in_FS_OFFSET;
  bool local_2a;
  bool local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = (this->m_waste).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  inline_assertion_check<true,bool>
            (&local_29,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
             ,0x3b7,"operator<","m_waste.has_value()");
  local_2a = *(bool *)(in_RSI + 0x48);
  inline_assertion_check<true,bool>
            (&local_2a,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
             ,0x3b8,"operator<","other.m_waste.has_value()");
  lVar1 = (this->m_waste).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value;
  bVar2 = true;
  if (*(long *)(in_RSI + 0x40) <= lVar1) {
    if (lVar1 == *(long *)(in_RSI + 0x40)) {
      bVar2 = *(ulong *)(in_RSI + 0x28) <
              (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SelectionResult::operator<(SelectionResult other) const
{
    Assert(m_waste.has_value());
    Assert(other.m_waste.has_value());
    // As this operator is only used in std::min_element, we want the result that has more inputs when waste are equal.
    return *m_waste < *other.m_waste || (*m_waste == *other.m_waste && m_selected_inputs.size() > other.m_selected_inputs.size());
}